

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplaceRealloc<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,pointer pos,Trivia *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Trivia *__cur_1;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pTVar4 = (pointer)operator_new((long)pEVar8 << 4);
  uVar3 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar4 + lVar9) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar4 + lVar9))[1] = uVar3;
  pTVar7 = this->data_;
  pTVar5 = pTVar7 + this->len;
  pTVar6 = pTVar4;
  if (pTVar5 == pos) {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      uVar3 = *(undefined8 *)((long)&pTVar7->field_0 + 8);
      (pTVar6->field_0).rawText.ptr = (pTVar7->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar6->field_0 + 8) = uVar3;
      pTVar6 = pTVar6 + 1;
    }
  }
  else {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      uVar3 = *(undefined8 *)((long)&pTVar7->field_0 + 8);
      (pTVar6->field_0).rawText.ptr = (pTVar7->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar6->field_0 + 8) = uVar3;
      pTVar6 = pTVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pTVar4);
    for (; pos != pTVar5; pos = pos + 1) {
      uVar3 = *(undefined8 *)((long)&pos->field_0 + 8);
      puVar2[2] = (pos->field_0).rawText.ptr;
      puVar2[3] = uVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pTVar4;
  return (pointer)((long)pTVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}